

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O3

void __thiscall bloaty::Regex::InternalSwap(Regex *this,Regex *other)

{
  uint32 uVar1;
  void *pvVar2;
  ArenaStringPtr *pAVar3;
  UnknownFieldSet *other_00;
  string *psVar4;
  
  pvVar2 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar2 & 1) != 0) {
LAB_0019909c:
      other_00 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
      goto LAB_001990a0;
    }
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_0019909c;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
LAB_001990a0:
    google::protobuf::internal::InternalMetadataWithArena::DoSwap
              (&this->_internal_metadata_,other_00);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pAVar3 = &other->pattern_;
  psVar4 = (this->pattern_).ptr_;
  if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar3->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
       ) goto LAB_00199115;
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (&this->pattern_,(Arena *)0x0,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
    psVar4 = (this->pattern_).ptr_;
  }
  if (pAVar3->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
  {
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (pAVar3,(Arena *)0x0,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar4);
LAB_00199115:
  pAVar3 = &other->replacement_;
  psVar4 = (this->replacement_).ptr_;
  if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar3->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
       ) {
      return;
    }
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (&this->replacement_,(Arena *)0x0,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
    psVar4 = (this->replacement_).ptr_;
  }
  if (pAVar3->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
  {
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (pAVar3,(Arena *)0x0,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar4);
  return;
}

Assistant:

void Regex::InternalSwap(Regex* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  pattern_.Swap(&other->pattern_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  replacement_.Swap(&other->replacement_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
}